

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void basist::encode_bc1(void *pDst,uint8_t *pPixels,uint32_t flags)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [14];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  unkuint9 Var12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [13];
  undefined1 auVar15 [14];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  uint32_t i_4;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint32_t hg;
  uint fb;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  byte bVar27;
  uint32_t i;
  int iVar28;
  int iVar29;
  long lVar30;
  uint8_t *puVar31;
  int iVar32;
  uint32_t i_1;
  int iVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  int iVar38;
  uint uVar39;
  uint uVar40;
  bool bVar41;
  float fVar42;
  undefined1 auVar43 [15];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  byte *local_98;
  float cov [6];
  vec3F xl;
  uint8_t sels [16];
  
  if ((flags & 4) == 0) {
    uVar35 = (uint)*pPixels;
    uVar39 = (uint)pPixels[1];
    fb = (uint)pPixels[2];
    lVar30 = 1;
    do {
      if (lVar30 == 0x10) {
        encode_bc1_solid_block(pDst,uVar35,uVar39,fb);
        return;
      }
    } while (((pPixels[lVar30 * 4] == *pPixels) && (pPixels[lVar30 * 4 + 1] == pPixels[1])) &&
            (lVar1 = lVar30 * 4, lVar30 = lVar30 + 1, pPixels[lVar1 + 2] == pPixels[2]));
    uVar36 = uVar35;
    uVar34 = uVar35;
    uVar40 = uVar39;
    uVar22 = uVar39;
    uVar23 = fb;
    uVar21 = fb;
    for (lVar30 = 1; lVar30 != 0x10; lVar30 = lVar30 + 1) {
      bVar27 = pPixels[lVar30 * 4];
      uVar37 = (uint)bVar27;
      if (uVar35 <= bVar27) {
        uVar35 = uVar37;
      }
      bVar2 = pPixels[lVar30 * 4 + 1];
      uVar18 = (uint)bVar2;
      if (uVar39 <= bVar2) {
        uVar39 = uVar18;
      }
      bVar3 = pPixels[lVar30 * 4 + 2];
      if (uVar21 <= bVar3) {
        uVar21 = (uint)bVar3;
      }
      if (uVar37 <= uVar34) {
        uVar34 = uVar37;
      }
      if (uVar18 <= uVar22) {
        uVar22 = uVar18;
      }
      if (bVar3 <= fb) {
        fb = (uint)bVar3;
      }
      uVar36 = uVar36 + bVar27;
      uVar40 = uVar40 + bVar2;
      uVar23 = uVar23 + bVar3;
    }
    uVar37 = uVar36 + 8 >> 4;
    uVar40 = uVar40 + 8 >> 4;
    uVar36 = uVar23 + 8 >> 4;
    xl.c[2] = 0.0;
    xl.c[1] = 0.0;
    xl.c[0] = 0.0;
    for (lVar30 = 0; lVar30 != 0x10; lVar30 = lVar30 + 1) {
      iVar26 = pPixels[lVar30 * 4] - uVar37;
      xl.c[0] = (float)((int)xl.c[0] + iVar26 * iVar26);
      xl.c[1] = (float)((int)xl.c[1] + (pPixels[lVar30 * 4 + 1] - uVar40) * iVar26);
      xl.c[2] = (float)((int)xl.c[2] + iVar26 * (pPixels[lVar30 * 4 + 2] - uVar36));
    }
    for (lVar30 = 0; lVar30 != 6; lVar30 = lVar30 + 1) {
      cov[lVar30] = (float)(int)xl.c[lVar30] * 0.003921569;
    }
    fVar42 = (float)(int)(uVar21 - fb);
    iVar26 = 4;
    fVar46 = (float)(int)(uVar39 - uVar22);
    fVar49 = (float)(int)(uVar35 - uVar34);
    while (bVar41 = iVar26 != 0, iVar26 = iVar26 + -1, bVar41) {
      fVar51 = fVar46 * cov[1];
      fVar50 = fVar42 * cov[2];
      fVar52 = fVar42 * cov[4];
      fVar42 = fVar42 * cov[5] + fVar46 * cov[4] + fVar49 * cov[2];
      fVar46 = fVar52 + fVar46 * cov[3] + fVar49 * cov[1];
      fVar49 = fVar50 + fVar51 + fVar49 * cov[0];
    }
    fVar50 = ABS(fVar49);
    if (ABS(fVar49) <= ABS(fVar46)) {
      fVar50 = ABS(fVar46);
    }
    if (fVar50 <= ABS(fVar42)) {
      fVar50 = ABS(fVar42);
    }
    if (2.0 <= fVar50) {
      fVar50 = 1024.0 / fVar50;
      iVar19 = (int)(fVar49 * fVar50);
      iVar24 = (int)(fVar46 * fVar50);
      iVar26 = (int)(fVar42 * fVar50);
    }
    else {
      iVar26 = 0x75;
      iVar24 = 0x259;
      iVar19 = 0x132;
    }
    iVar38 = -0x80000000;
    iVar32 = 0;
    uVar20 = 0;
    iVar28 = 0x7fffffff;
    for (uVar25 = 0; uVar25 != 0x10; uVar25 = uVar25 + 1) {
      iVar33 = (uint)pPixels[uVar25 * 4 + 2] * iVar26 +
               (uint)pPixels[uVar25 * 4 + 1] * iVar24 + (uint)pPixels[uVar25 * 4] * iVar19;
      iVar29 = iVar28;
      if (iVar33 < iVar28) {
        iVar29 = iVar33;
      }
      if (iVar33 < iVar28) {
        iVar32 = (int)uVar25;
      }
      if (iVar38 < iVar33) {
        uVar20 = uVar25 & 0xffffffff;
        iVar38 = iVar33;
      }
      iVar28 = iVar29;
    }
    lVar30 = (long)iVar32;
    local_a4 = (uint)pPixels[lVar30 * 4] * 0x1f + ((uint)pPixels[lVar30 * 4] * 0x1f + 0x80 >> 8) +
               0x80 >> 8;
    local_ac = ((uint)pPixels[lVar30 * 4 + 1] * 0x3f + 0x80 >> 8) +
               (uint)pPixels[lVar30 * 4 + 1] * 0x3f + 0x80 >> 8;
    local_b0 = ((uint)pPixels[lVar30 * 4 + 2] * 0x1f + 0x80 >> 8) +
               (uint)pPixels[lVar30 * 4 + 2] * 0x1f + 0x80 >> 8;
    lVar30 = (long)(int)uVar20;
    local_a8 = (uint)pPixels[lVar30 * 4] * 0x1f + ((uint)pPixels[lVar30 * 4] * 0x1f + 0x80 >> 8) +
               0x80 >> 8;
    hg = ((uint)pPixels[lVar30 * 4 + 1] * 0x3f + 0x80 >> 8) + (uint)pPixels[lVar30 * 4 + 1] * 0x3f +
         0x80 >> 8;
    uVar35 = ((uint)pPixels[lVar30 * 4 + 2] * 0x1f + 0x80 >> 8) +
             (uint)pPixels[lVar30 * 4 + 2] * 0x1f + 0x80 >> 8;
    bc1_find_sels((color32 *)pPixels,local_a4,local_ac,local_b0,local_a8,hg,uVar35,sels);
  }
  else {
    uVar36 = *(uint *)((long)pDst + 4);
    puVar31 = sels;
    uVar35 = 0;
    uVar37 = 0xffffffff;
    for (lVar30 = 0; lVar30 != 0x20; lVar30 = lVar30 + 2) {
      *puVar31 = ""[uVar36 >> ((byte)lVar30 & 0x1f) & 3];
      puVar31 = puVar31 + 1;
    }
    hg = 0;
    local_a8 = 0;
    local_b0 = 0;
    local_ac = 0;
    local_a4 = 0;
    uVar36 = 0;
    uVar40 = 0;
  }
  iVar26 = 3;
  if ((flags & 2) == 0) {
    iVar26 = (flags & 1) + 1;
  }
  local_98 = sels;
  for (iVar19 = 0; iVar19 != iVar26; iVar19 = iVar19 + 1) {
    bVar41 = compute_least_squares_endpoints_rgb((color32 *)pPixels,sels,&xl,(vec3F *)cov);
    if (bVar41) {
      auVar44._0_4_ = (int)(cov[0] * 0.12156863 + 0.5);
      auVar44._4_4_ = (int)(xl.c[0] * 0.12156863 + 0.5);
      auVar44._8_4_ = (int)(xl.c[1] * 0.24705882 + 0.5);
      auVar44._12_4_ = (int)(xl.c[2] * 0.12156863 + 0.5);
      auVar47._0_4_ = -(uint)(auVar44._0_4_ < (int)DAT_001cc6d0);
      auVar47._4_4_ = -(uint)(auVar44._4_4_ < DAT_001cc6d0._4_4_);
      auVar47._8_4_ = -(uint)(auVar44._8_4_ < DAT_001cc6d0._8_4_);
      auVar47._12_4_ = -(uint)(auVar44._12_4_ < DAT_001cc6d0._12_4_);
      auVar48 = ~auVar47 & _DAT_001cc6d0 | auVar44 & auVar47;
      hg = (uint32_t)(cov[1] * 0.24705882 + 0.5);
      if (0x3e < (int)hg) {
        hg = 0x3f;
      }
      uVar35 = (uint)(cov[2] * 0.12156863 + 0.5);
      if ((int)hg < 1) {
        hg = 0;
      }
      auVar45._0_4_ = -(uint)(0 < auVar48._0_4_);
      auVar45._4_4_ = -(uint)(0 < auVar48._4_4_);
      auVar45._8_4_ = -(uint)(0 < auVar48._8_4_);
      auVar45._12_4_ = -(uint)(0 < auVar48._12_4_);
      if (0x1e < (int)uVar35) {
        uVar35 = 0x1f;
      }
      auVar48 = auVar45 & auVar48;
      if ((int)uVar35 < 1) {
        uVar35 = 0;
      }
    }
    else {
      if ((int)uVar37 < 0) {
        iVar38 = 0;
        iVar32 = 0;
        iVar24 = 0;
        for (lVar30 = 0; lVar30 != 0x10; lVar30 = lVar30 + 1) {
          iVar38 = iVar38 + (uint)pPixels[lVar30 * 4];
          iVar32 = iVar32 + (uint)pPixels[lVar30 * 4 + 1];
          iVar24 = iVar24 + (uint)pPixels[lVar30 * 4 + 2];
        }
        uVar37 = iVar38 + 8U >> 4;
        uVar40 = iVar32 + 8U >> 4;
        uVar36 = iVar24 + 8U >> 4;
      }
      auVar48 = psllw(ZEXT216(*(ushort *)(g_bc1_match5_equals_1 + (ulong)uVar37 * 2)),8);
      auVar43 = ZEXT115((byte)g_bc1_match5_equals_1[(ulong)uVar36 * 2]) << 0x18 |
                (~DAT_001cc690._0_15_ &
                 ZEXT115((byte)g_bc1_match6_equals_1[(ulong)uVar40 * 2]) << 0x10 |
                (auVar48._0_15_ |
                ZEXT215(*(ushort *)(g_bc1_match5_equals_1 + (ulong)uVar37 * 2) >> 8)) &
                DAT_001cc690._0_15_) & DAT_001cc6a0._0_15_;
      auVar4[0xd] = 0;
      auVar4._0_13_ = auVar43._0_13_;
      auVar4[0xe] = auVar43[7];
      auVar6[0xc] = auVar43[6];
      auVar6._0_12_ = auVar43._0_12_;
      auVar6._13_2_ = auVar4._13_2_;
      auVar7[0xb] = 0;
      auVar7._0_11_ = auVar43._0_11_;
      auVar7._12_3_ = auVar6._12_3_;
      auVar8[10] = auVar43[5];
      auVar8._0_10_ = auVar43._0_10_;
      auVar8._11_4_ = auVar7._11_4_;
      auVar9[9] = 0;
      auVar9._0_9_ = auVar43._0_9_;
      auVar9._10_5_ = auVar8._10_5_;
      auVar10[8] = auVar43[4];
      auVar10._0_8_ = auVar43._0_8_;
      auVar10._9_6_ = auVar9._9_6_;
      auVar11._7_8_ = 0;
      auVar11._0_7_ = auVar10._8_7_;
      Var12 = CONCAT81(SUB158(auVar11 << 0x40,7),auVar43[3]);
      auVar16._9_6_ = 0;
      auVar16._0_9_ = Var12;
      auVar13._1_10_ = SUB1510(auVar16 << 0x30,5);
      auVar13[0] = auVar43[2];
      auVar17._11_4_ = 0;
      auVar17._0_11_ = auVar13;
      auVar14._1_12_ = SUB1512(auVar17 << 0x20,3);
      auVar14[0] = auVar43[1];
      auVar48._0_2_ = CONCAT11(0,auVar43[0]);
      auVar43._2_13_ = auVar14;
      auVar43._0_2_ = auVar48._0_2_;
      auVar5._10_2_ = 0;
      auVar5._0_10_ = auVar43._0_10_;
      auVar5._12_2_ = (short)Var12;
      auVar15._2_4_ = auVar5._10_4_;
      auVar15._0_2_ = auVar13._0_2_;
      auVar15._6_8_ = 0;
      auVar48._6_8_ = SUB148(auVar15 << 0x40,6);
      auVar48._4_2_ = auVar14._0_2_;
      auVar48._2_2_ = 0;
      auVar48._14_2_ = 0;
      hg = (uint32_t)(byte)g_bc1_match6_equals_1[(ulong)uVar40 * 2 + 1];
      uVar35 = (uint)(byte)g_bc1_match5_equals_1[(ulong)uVar36 * 2 + 1];
    }
    local_a8 = auVar48._0_4_;
    local_a4 = auVar48._4_4_;
    local_ac = auVar48._8_4_;
    local_b0 = auVar48._12_4_;
    bc1_find_sels((color32 *)pPixels,local_a4,local_ac,local_b0,local_a8,hg,uVar35,sels);
  }
  uVar36 = (local_a4 << 0xb | local_ac << 5 | local_b0) & 0xffff;
  uVar37 = (local_a8 << 0xb | hg << 5 | uVar35) & 0xffff;
  if (uVar36 == uVar37) {
    iVar26 = uVar36 - 1;
    if (uVar36 == 0) {
      iVar26 = 0;
    }
    iVar19 = uVar36 + (uVar36 == 0);
    *(char *)pDst = (char)iVar19;
    *(char *)((long)pDst + 1) = (char)((uint)iVar19 >> 8);
    *(char *)((long)pDst + 2) = (char)iVar26;
    *(char *)((long)pDst + 3) = (char)((uint)iVar26 >> 8);
    iVar26 = 0x55555555;
    if (uVar36 != 0) {
      iVar26 = 0;
    }
    *(int *)((long)pDst + 4) = iVar26;
  }
  else {
    uVar40 = 0;
    uVar35 = uVar37;
    if (uVar37 < uVar36) {
      uVar35 = uVar36;
    }
    uVar39 = uVar37;
    if (uVar36 < uVar37) {
      uVar39 = uVar36;
    }
    bVar27 = 0x55;
    if (uVar36 >= uVar37) {
      bVar27 = 0;
    }
    if (uVar35 <= uVar39) {
      __assert_fail("lc16 > hc16",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x3b0e,"void basist::encode_bc1(void *, const uint8_t *, uint32_t)");
    }
    *(char *)pDst = (char)uVar35;
    *(char *)((long)pDst + 1) = (char)(uVar35 >> 8);
    *(char *)((long)pDst + 2) = (char)uVar39;
    *(char *)((long)pDst + 3) = (char)(uVar39 >> 8);
    for (lVar30 = 0; lVar30 != 0x20; lVar30 = lVar30 + 2) {
      uVar40 = uVar40 | (uint)""[*local_98] << ((byte)lVar30 & 0x1f);
      local_98 = local_98 + 1;
    }
    *(byte *)((long)pDst + 4) = (byte)uVar40 ^ bVar27;
    *(byte *)((long)pDst + 5) = (byte)(uVar40 >> 8) ^ bVar27;
    *(byte *)((long)pDst + 6) = (byte)(uVar40 >> 0x10) ^ bVar27;
    *(byte *)((long)pDst + 7) = (byte)(uVar40 >> 0x18) ^ bVar27;
  }
  return;
}

Assistant:

void encode_bc1(void* pDst, const uint8_t* pPixels, uint32_t flags)
	{
		const color32* pSrc_pixels = (const color32*)pPixels;
		dxt1_block* pDst_block = static_cast<dxt1_block*>(pDst);
		
		int avg_r = -1, avg_g = 0, avg_b = 0;
		int lr = 0, lg = 0, lb = 0, hr = 0, hg = 0, hb = 0;
		uint8_t sels[16];
		
		const bool use_sels = (flags & cEncodeBC1UseSelectors) != 0;
		if (use_sels)
		{
			// Caller is jamming in their own selectors for us to try.
			const uint32_t s = pDst_block->m_selectors[0] | (pDst_block->m_selectors[1] << 8) | (pDst_block->m_selectors[2] << 16) | (pDst_block->m_selectors[3] << 24);
			
			static const uint8_t s_sel_tran[4] = { 0, 3, 1, 2 };
			
			for (uint32_t i = 0; i < 16; i++)
				sels[i] = s_sel_tran[(s >> (i * 2)) & 3];
		}
		else
		{
			const uint32_t fr = pSrc_pixels[0].r, fg = pSrc_pixels[0].g, fb = pSrc_pixels[0].b;

			uint32_t j;
			for (j = 1; j < 16; j++)
				if ((pSrc_pixels[j].r != fr) || (pSrc_pixels[j].g != fg) || (pSrc_pixels[j].b != fb))
					break;
						
			if (j == 16)
			{
				encode_bc1_solid_block(pDst, fr, fg, fb);
				return;
			}
			
			// Select 2 colors along the principle axis. (There must be a faster/simpler way.)
			int total_r = fr, total_g = fg, total_b = fb;
			int max_r = fr, max_g = fg, max_b = fb;
			int min_r = fr, min_g = fg, min_b = fb;
			for (uint32_t i = 1; i < 16; i++)
			{
				const int r = pSrc_pixels[i].r, g = pSrc_pixels[i].g, b = pSrc_pixels[i].b;
				max_r = basisu::maximum(max_r, r); max_g = basisu::maximum(max_g, g); max_b = basisu::maximum(max_b, b);
				min_r = basisu::minimum(min_r, r); min_g = basisu::minimum(min_g, g); min_b = basisu::minimum(min_b, b);
				total_r += r; total_g += g; total_b += b;
			}

			avg_r = (total_r + 8) >> 4;
			avg_g = (total_g + 8) >> 4;
			avg_b = (total_b + 8) >> 4;

			int icov[6] = { 0, 0, 0, 0, 0, 0 };
			for (uint32_t i = 0; i < 16; i++)
			{
				int r = (int)pSrc_pixels[i].r - avg_r;
				int g = (int)pSrc_pixels[i].g - avg_g;
				int b = (int)pSrc_pixels[i].b - avg_b;
				icov[0] += r * r;
				icov[1] += r * g;
				icov[2] += r * b;
				icov[3] += g * g;
				icov[4] += g * b;
				icov[5] += b * b;
			}

			float cov[6];
			for (uint32_t i = 0; i < 6; i++)
				cov[i] = static_cast<float>(icov[i])* (1.0f / 255.0f);
			
#if 0
			// Seems silly to use full PCA to choose 2 colors. The diff in avg. PSNR between using PCA vs. not is small (~.025 difference).
			// TODO: Try 2 or 3 different normalized diagonal vectors, choose the one that results in the largest dot delta
			int saxis_r = max_r - min_r;
			int saxis_g = max_g - min_g;
			int saxis_b = max_b - min_b;
#else
			float xr = (float)(max_r - min_r);
			float xg = (float)(max_g - min_g);
			float xb = (float)(max_b - min_b);
			//float xr = (float)(max_r - avg_r); // max-avg is nearly the same, and doesn't require computing min's
			//float xg = (float)(max_g - avg_g);
			//float xb = (float)(max_b - avg_b);
			for (uint32_t power_iter = 0; power_iter < 4; power_iter++)
			{
				float r = xr * cov[0] + xg * cov[1] + xb * cov[2];
				float g = xr * cov[1] + xg * cov[3] + xb * cov[4];
				float b = xr * cov[2] + xg * cov[4] + xb * cov[5];
				xr = r; xg = g; xb = b;
			}

			float k = basisu::maximum(fabsf(xr), fabsf(xg), fabsf(xb));
			int saxis_r = 306, saxis_g = 601, saxis_b = 117;
			if (k >= 2)
			{
				float m = 1024.0f / k;
				saxis_r = (int)(xr * m);
				saxis_g = (int)(xg * m);
				saxis_b = (int)(xb * m);
			}
#endif
			
			int low_dot = INT_MAX, high_dot = INT_MIN, low_c = 0, high_c = 0;
			for (uint32_t i = 0; i < 16; i++)
			{
				int dot = pSrc_pixels[i].r * saxis_r + pSrc_pixels[i].g * saxis_g + pSrc_pixels[i].b * saxis_b;
				if (dot < low_dot)
				{
					low_dot = dot;
					low_c = i;
				}
				if (dot > high_dot)
				{
					high_dot = dot;
					high_c = i;
				}
			}

			lr = to_5(pSrc_pixels[low_c].r);
			lg = to_6(pSrc_pixels[low_c].g);
			lb = to_5(pSrc_pixels[low_c].b);

			hr = to_5(pSrc_pixels[high_c].r);
			hg = to_6(pSrc_pixels[high_c].g);
			hb = to_5(pSrc_pixels[high_c].b);
						
			bc1_find_sels(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels);
		} // if (use_sels)

		const uint32_t total_ls_passes = (flags & cEncodeBC1HigherQuality) ? 3 : (flags & cEncodeBC1HighQuality ? 2 : 1);
		for (uint32_t ls_pass = 0; ls_pass < total_ls_passes; ls_pass++)
		{
			// This is where the real magic happens. We have an array of candidate selectors, so let's use least squares to compute the optimal low/high endpoint colors.
			vec3F xl, xh;
			if (!compute_least_squares_endpoints_rgb(pSrc_pixels, sels, &xl, &xh))
			{
				if (avg_r < 0)
				{
					int total_r = 0, total_g = 0, total_b = 0;
					for (uint32_t i = 0; i < 16; i++)
					{
						total_r += pSrc_pixels[i].r;
						total_g += pSrc_pixels[i].g;
						total_b += pSrc_pixels[i].b;
					}

					avg_r = (total_r + 8) >> 4;
					avg_g = (total_g + 8) >> 4;
					avg_b = (total_b + 8) >> 4;
				}

				// All selectors equal - treat it as a solid block which should always be equal or better.
				lr = g_bc1_match5_equals_1[avg_r].m_hi;
				lg = g_bc1_match6_equals_1[avg_g].m_hi;
				lb = g_bc1_match5_equals_1[avg_b].m_hi;

				hr = g_bc1_match5_equals_1[avg_r].m_lo;
				hg = g_bc1_match6_equals_1[avg_g].m_lo;
				hb = g_bc1_match5_equals_1[avg_b].m_lo;

				// In high/higher quality mode, let it try again in case the optimal tables have caused the sels to diverge.
			}
			else
			{
				lr = basisu::clamp((int)((xl.c[0]) * (31.0f / 255.0f) + .5f), 0, 31);
				lg = basisu::clamp((int)((xl.c[1]) * (63.0f / 255.0f) + .5f), 0, 63);
				lb = basisu::clamp((int)((xl.c[2]) * (31.0f / 255.0f) + .5f), 0, 31);

				hr = basisu::clamp((int)((xh.c[0]) * (31.0f / 255.0f) + .5f), 0, 31);
				hg = basisu::clamp((int)((xh.c[1]) * (63.0f / 255.0f) + .5f), 0, 63);
				hb = basisu::clamp((int)((xh.c[2]) * (31.0f / 255.0f) + .5f), 0, 31);
			}
									
			bc1_find_sels(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels);
		}

		uint32_t lc16 = dxt1_block::pack_unscaled_color(lr, lg, lb);
		uint32_t hc16 = dxt1_block::pack_unscaled_color(hr, hg, hb);
				
		// Always forbid 3 color blocks
		if (lc16 == hc16)
		{
			uint8_t mask = 0;

			// Make l > h
			if (hc16 > 0)
				hc16--;
			else
			{
				// lc16 = hc16 = 0
				assert(lc16 == hc16 && hc16 == 0);

				hc16 = 0;
				lc16 = 1;
				mask = 0x55; // select hc16
			}

			assert(lc16 > hc16);
			pDst_block->set_low_color(static_cast<uint16_t>(lc16));
			pDst_block->set_high_color(static_cast<uint16_t>(hc16));

			pDst_block->m_selectors[0] = mask;
			pDst_block->m_selectors[1] = mask;
			pDst_block->m_selectors[2] = mask;
			pDst_block->m_selectors[3] = mask;
		}
		else
		{
			uint8_t invert_mask = 0;
			if (lc16 < hc16)
			{
				std::swap(lc16, hc16);
				invert_mask = 0x55;
			}

			assert(lc16 > hc16);
			pDst_block->set_low_color((uint16_t)lc16);
			pDst_block->set_high_color((uint16_t)hc16);

			uint32_t packed_sels = 0;
			static const uint8_t s_sel_trans[4] = { 0, 2, 3, 1 };
			for (uint32_t i = 0; i < 16; i++)
				packed_sels |= ((uint32_t)s_sel_trans[sels[i]] << (i * 2));

			pDst_block->m_selectors[0] = (uint8_t)packed_sels ^ invert_mask;
			pDst_block->m_selectors[1] = (uint8_t)(packed_sels >> 8) ^ invert_mask;
			pDst_block->m_selectors[2] = (uint8_t)(packed_sels >> 16) ^ invert_mask;
			pDst_block->m_selectors[3] = (uint8_t)(packed_sels >> 24) ^ invert_mask;
		}
	}